

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

curl_mimepart * curl_mime_addpart(curl_mime *mime)

{
  Curl_easy *pCVar1;
  curl_mimepart *__s;
  curl_mimepart *pcVar2;
  
  if (mime == (curl_mime *)0x0) {
    __s = (curl_mimepart *)0x0;
  }
  else {
    __s = (curl_mimepart *)(*Curl_cmalloc)(0x1c8);
    if (__s != (curl_mimepart *)0x0) {
      pCVar1 = mime->easy;
      memset(__s,0,0x1c8);
      __s->easy = pCVar1;
      __s->lastreadstatus = 1;
      (__s->state).state = MIMESTATE_BEGIN;
      (__s->state).ptr = (void *)0x0;
      (__s->state).offset = 0;
      __s->parent = mime;
      pcVar2 = mime->lastpart;
      if (mime->lastpart == (curl_mimepart *)0x0) {
        pcVar2 = (curl_mimepart *)mime;
      }
      pcVar2->nextpart = __s;
      mime->lastpart = __s;
    }
  }
  return __s;
}

Assistant:

curl_mimepart *curl_mime_addpart(curl_mime *mime)
{
  curl_mimepart *part;

  if(!mime)
    return NULL;

  part = (curl_mimepart *) malloc(sizeof(*part));

  if(part) {
    Curl_mime_initpart(part, mime->easy);
    part->parent = mime;

    if(mime->lastpart)
      mime->lastpart->nextpart = part;
    else
      mime->firstpart = part;

    mime->lastpart = part;
  }

  return part;
}